

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateActivation
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  LayerUnion LVar3;
  Result r;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [8];
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string local_90;
  string local_70;
  string local_50;
  
  Result::Result((Result *)local_e0);
  validateInputCount((Result *)local_b8,layer,1,1);
  local_e0 = local_b8;
  std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
  }
  bVar2 = Result::good((Result *)local_e0);
  if (bVar2) {
    validateOutputCount((Result *)local_b8,layer,1,1);
    local_e0 = local_b8;
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_p != &local_a0) {
      operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
    }
  }
  bVar2 = Result::good((Result *)local_e0);
  if (!bVar2) goto LAB_002ca093;
  if (this->ndArrayInterpretation == true) {
    if (layer->_oneof_case_[0] == 0x82) {
      LVar3 = layer->layer_;
    }
    else {
      LVar3.activation_ = Specification::ActivationParams::default_instance();
    }
    if (*(uint32 *)((long)&(LVar3.convolution_)->kernelsize_ + 0xc) == 0x19) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ActivationPReLU","");
      validateInputOutputRankEquality((Result *)local_b8,layer,&local_50,&this->blobNameToRank);
      local_e0 = local_b8;
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_p != &local_a0) {
        operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar2 = Result::good((Result *)local_e0);
      if (bVar2) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"ActivationPReLU","");
        validateRankCount((Result *)local_b8,layer,&local_90,3,-1,&this->blobNameToRank);
        local_e0 = local_b8;
        std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_p != &local_a0) {
          operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        bVar2 = Result::good((Result *)local_e0);
        if (bVar2) goto LAB_002c9f24;
      }
    }
    else {
LAB_002c9f24:
      if (layer->_oneof_case_[0] == 0x82) {
        LVar3 = layer->layer_;
      }
      else {
        LVar3.activation_ = Specification::ActivationParams::default_instance();
      }
      if (*(uint32 *)((long)&(LVar3.convolution_)->kernelsize_ + 0xc) != 0x47) goto LAB_002ca07d;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"ActivationParametricSoftplus","");
      validateInputOutputRankEquality((Result *)local_b8,layer,&local_70,&this->blobNameToRank);
      local_e0 = local_b8;
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_p != &local_a0) {
        operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      bVar2 = Result::good((Result *)local_e0);
      if (bVar2) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"ActivationParametricSoftplus","");
        validateRankCount((Result *)local_b8,layer,&local_90,3,-1,&this->blobNameToRank);
        local_e0 = local_b8;
        std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_p != &local_a0) {
          operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        bVar2 = Result::good((Result *)local_e0);
        if (bVar2) goto LAB_002ca07d;
      }
    }
LAB_002ca093:
    __return_storage_ptr__->m_type = local_e0._0_4_;
    __return_storage_ptr__->m_reason = local_e0._4_4_;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p == &local_c8) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_c8._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_d8._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_d0;
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_d8._M_p = (pointer)&local_c8;
  }
  else {
LAB_002ca07d:
    if (layer->_oneof_case_[0] == 0x82) {
      LVar3 = layer->layer_;
    }
    else {
      LVar3.activation_ = Specification::ActivationParams::default_instance();
    }
    validateActivationParams(__return_storage_ptr__,LVar3.activation_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,
                    CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateActivation(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()) {return r;}
    if (ndArrayInterpretation) {
        if (layer.activation().NonlinearityType_case() == Specification::ActivationParams::NonlinearityTypeCase::kPReLU) {
            r = validateInputOutputRankEquality(layer, "ActivationPReLU", blobNameToRank);
            if (!r.good()) {return r;}
            r = validateRankCount(layer, "ActivationPReLU", 3, -1, blobNameToRank);
            if (!r.good()) {return r;}
        }
        if (layer.activation().NonlinearityType_case() == Specification::ActivationParams::NonlinearityTypeCase::kParametricSoftplus) {
            r = validateInputOutputRankEquality(layer, "ActivationParametricSoftplus", blobNameToRank);
            if (!r.good()) {return r;}
            r = validateRankCount(layer, "ActivationParametricSoftplus", 3, -1, blobNameToRank);
            if (!r.good()) {return r;}
        }
    }

    return validateActivationParams(layer.activation());
}